

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluCheckNonDisjointGroup(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g)

{
  word local_4048;
  word pCofs [2] [1024];
  int local_40;
  int nCofsBest2;
  int i;
  int v;
  If_Grp_t *g_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *pF_local;
  
  if ((g->nMyu == '\x03') || (g->nMyu == '\x04')) {
    for (nCofsBest2 = 0; nCofsBest2 < g->nVars; nCofsBest2 = nCofsBest2 + 1) {
      If_CluCofactors(pF,nVars,V2P[(int)g->pVars[nCofsBest2]],&local_4048,pCofs[0] + 0x3ff);
      pCofs[1][0x3ff]._4_4_ = If_CluCountCofs(&local_4048,nVars,(int)g->nVars,0,(word (*) [256])0x0)
      ;
      if ((pCofs[1][0x3ff]._4_4_ < 3) &&
         (pCofs[1][0x3ff]._4_4_ =
               If_CluCountCofs(pCofs[0] + 0x3ff,nVars,(int)g->nVars,0,(word (*) [256])0x0),
         pCofs[1][0x3ff]._4_4_ < 3)) {
        If_CluMoveVar(pF,nVars,V2P,P2V,(int)g->pVars[nCofsBest2],nVars + -1);
        for (local_40 = 0; local_40 < g->nVars; local_40 = local_40 + 1) {
          g->pVars[local_40] = (char)P2V[(nVars - g->nVars) + local_40];
        }
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int If_CluCheckNonDisjointGroup( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g )
{
    int v, i, nCofsBest2;
    if ( (g->nMyu == 3 || g->nMyu == 4) )
    {
        word pCofs[2][CLU_WRD_MAX];
        // try cofactoring w.r.t. each variable
        for ( v = 0; v < g->nVars; v++ )
        {
            If_CluCofactors( pF, nVars, V2P[(int)g->pVars[v]], pCofs[0], pCofs[1] );
            nCofsBest2 = If_CluCountCofs( pCofs[0], nVars, g->nVars, 0, NULL );
            if ( nCofsBest2 > 2 )
                continue;
            nCofsBest2 = If_CluCountCofs( pCofs[1], nVars, g->nVars, 0, NULL );
            if ( nCofsBest2 > 2 )
                continue;
            // found good shared variable - move to the end
            If_CluMoveVar( pF, nVars, V2P, P2V, g->pVars[v], nVars-1 );
            for ( i = 0; i < g->nVars; i++ )
                g->pVars[i] = P2V[nVars-g->nVars+i];
            return 1;
        }
    }
    return 0;
}